

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86internal.cpp
# Opt level: O2

Error asmjit::X86Internal::emitArgMove
                (X86Emitter *emitter,X86Reg *dst_,uint32_t dstTypeId,Operand_ *src_,
                uint32_t srcTypeId,bool avxEnabled,char *comment)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  undefined4 uVar4;
  Error EVar5;
  undefined4 uVar6;
  uint uVar7;
  uint uVar8;
  uint32_t uVar9;
  uint uVar10;
  uint uVar11;
  Operand src;
  X86Reg dst;
  
  if (dstTypeId == 0) {
    dstTypeId = (uint32_t)
                (byte)x86OpData[(ulong)((dst_->super_Reg).super_Operand.super_Operand_.field_0._any.
                                        signature >> 3 & 0x1f) + 0xa0];
  }
  if ((0x44 < dstTypeId - 0x20) || ((dstTypeId & 0x7e) == 0x20)) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/x86/x86internal.cpp"
               ,0x339,"TypeId::isValid(dstTypeId) && !TypeId::isAbstract(dstTypeId)");
  }
  uVar3 = srcTypeId - 0x20;
  if ((0x44 < uVar3) || ((srcTypeId & 0x7e) == 0x20)) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/x86/x86internal.cpp"
               ,0x33a,"TypeId::isValid(srcTypeId) && !TypeId::isAbstract(srcTypeId)");
  }
  dst.super_Reg.super_Operand.super_Operand_.field_0._packed[0] =
       (UInt64)*(undefined8 *)&(dst_->super_Reg).super_Operand.super_Operand_.field_0;
  dst.super_Reg.super_Operand.super_Operand_.field_0._mem.field_2 =
       (dst_->super_Reg).super_Operand.super_Operand_.field_0._mem.field_2;
  bVar1 = TypeId::_info[dstTypeId];
  bVar2 = TypeId::_info[srcTypeId];
  src.super_Operand_.field_0._packed[0] = (UInt64)*(undefined8 *)&src_->field_0;
  src.super_Operand_.field_0._mem.field_2 = (src_->field_0)._mem.field_2;
  uVar11 = (uint)bVar1;
  uVar7 = (uint)bVar2;
  if (dstTypeId - 0x20 < 10) {
    if (uVar3 < 10) {
      uVar3 = 0x1a9;
      uVar8 = dstTypeId << 8 | srcTypeId;
      uVar10 = (uint)bVar2;
      if ((((uVar8 == 0x2422) || (uVar10 = uVar7, uVar8 == 0x2622)) || (uVar8 == 0x2624)) ||
         ((uVar8 == 0x2822 || (uVar8 == 0x2824)))) goto LAB_00160305;
      if (uVar8 == 0x2826) {
        uVar3 = 0x1aa;
        goto LAB_00160305;
      }
    }
    else if (((src_->field_0)._any.signature & 7) != 2) {
      if (uVar11 < uVar7) {
        bVar2 = bVar1;
      }
      uVar10 = (uint)bVar2;
      if (srcTypeId - 0x31 < 2) {
        if (uVar10 != 8) {
          dst.super_Reg.super_Operand.super_Operand_.field_0._any.signature = 0x4000029;
          uVar3 = 0x18d;
          goto LAB_00160305;
        }
LAB_00160058:
        uVar3 = 0x1a2;
      }
      else {
        if (srcTypeId - 0x2d < 4) {
          dst.super_Reg.super_Operand.super_Operand_.field_0._any.signature = 0x4000029;
          if (uVar10 == 1) {
            uVar3 = 0x13f;
          }
          else if (uVar10 == 2) {
            uVar3 = 0x142;
          }
          else {
            uVar3 = uVar10 == 4 ^ 0x141;
            dst.super_Reg.super_Operand.super_Operand_.field_0._any.signature = 0x8000031;
            if (uVar10 < 5) {
              dst.super_Reg.super_Operand.super_Operand_.field_0._any.signature = 0x4000029;
            }
          }
          goto LAB_00160305;
        }
        if (0x31 < srcTypeId - 0x33) {
          return 4;
        }
        uVar3 = 0x1a2;
        if (avxEnabled) {
          uVar3 = 0x3f5;
        }
        if (uVar10 != 8) {
          dst.super_Reg.super_Operand.super_Operand_.field_0._any.signature = 0x4000029;
          uVar3 = 0x18d;
          if (avxEnabled) {
            uVar3 = 0x3df;
          }
          goto LAB_00160305;
        }
      }
LAB_0016005d:
      uVar10 = 8;
      goto LAB_00160305;
    }
    if ((bVar1 < 5) && (bVar2 < 4)) {
      dst.super_Reg.super_Operand.super_Operand_.field_0._any.signature = 0x4000029;
      uVar3 = 0x1ad;
      uVar10 = uVar7;
      goto LAB_00160305;
    }
    uVar3 = 0x189;
    uVar10 = (uint)bVar2;
    if (uVar11 < uVar7) {
      uVar10 = (uint)bVar1;
    }
    dst.super_Reg.super_Operand.super_Operand_.field_0._any.signature = 0x8000031;
    if (uVar10 == 4) {
      dst.super_Reg.super_Operand.super_Operand_.field_0._any.signature = 0x4000029;
    }
    uVar7 = src.super_Operand_.field_0._any.signature & 7;
LAB_0016014d:
    uVar4 = dst.super_Reg.super_Operand.super_Operand_.field_0._any.signature;
    if (uVar7 != 1) goto LAB_00160305;
LAB_00160156:
    src.super_Operand_.field_0._any.signature = uVar4;
  }
  else {
    if (dstTypeId - 0x31 < 2) {
      uVar10 = (uint)bVar2;
      if ((uint)bVar1 < (uint)bVar2) {
        uVar10 = (uint)bVar1;
      }
      if ((9 < uVar3) && ((src.super_Operand_.field_0._any.signature & 7) != 2)) {
        uVar3 = 0x1a2;
        if ((1 < srcTypeId - 0x31) && (uVar3 = 399, 0x31 < srcTypeId - 0x33)) {
          return 4;
        }
        goto LAB_00160305;
      }
      if (uVar10 == 8) goto LAB_00160058;
      uVar3 = 0x18d;
      uVar7 = src.super_Operand_.field_0._any.signature & 7;
joined_r0x00160387:
      if (uVar7 != 1) goto LAB_00160305;
    }
    else {
      if (3 < dstTypeId - 0x2d) {
        if (0x31 < dstTypeId - 0x33) {
          return 4;
        }
        uVar3 = 0x1a3;
        dst.super_Reg.super_Operand.super_Operand_.field_0._any.signature = 0x10000149;
        uVar10 = uVar7;
        if (src.super_Operand_.field_0._any.signature == 0x8000289) goto LAB_00160305;
        if (TypeId::_info[(ulong)srcTypeId + 0x80] != '+' ||
            TypeId::_info[(ulong)dstTypeId + 0x80] != '*') {
          if (TypeId::_info[(ulong)srcTypeId + 0x80] == '*' &&
              TypeId::_info[(ulong)dstTypeId + 0x80] == '+') {
            uVar7 = uVar7 * 2;
            if (uVar11 <= uVar7) {
              uVar7 = (uint)bVar1;
            }
            uVar10 = uVar7 >> 1;
            uVar9 = 0x80;
            if (avxEnabled) {
              uVar9 = 800;
            }
            uVar3 = 0x79;
            if (avxEnabled) {
              uVar3 = 0x312;
            }
            if (uVar7 < 10) {
              uVar3 = uVar9;
            }
            uVar6 = 0x40000159;
            if ((uVar7 & 0xfe) < 0x21) {
              uVar6 = 0x20000151;
            }
            dst.super_Reg.super_Operand.super_Operand_.field_0._any.signature = 0x10000149;
            if (0x10 < (uVar7 & 0xfe)) {
              dst.super_Reg.super_Operand.super_Operand_.field_0._any.signature = uVar6;
            }
            if (((src.super_Operand_.field_0._any.signature & 7) == 1) && (0x3f < uVar7)) {
              src.super_Operand_.field_0._any.signature = 0x20000151;
            }
            goto LAB_00160305;
          }
          uVar10 = (uint)bVar2;
          if (uVar11 < uVar7) {
            uVar10 = (uint)bVar1;
          }
          if ((src.super_Operand_.field_0._any.signature & 0xf07) == 1 ||
              (src.super_Operand_.field_0._any.signature & 7) == 2) {
            if (uVar10 < 5) {
              uVar3 = 0x18d;
              if (avxEnabled) {
                uVar3 = 0x3df;
              }
              uVar7 = src.super_Operand_.field_0._any.signature & 3;
              goto joined_r0x00160387;
            }
            if (uVar10 == 8) {
              uVar3 = 0x1a2;
              if (avxEnabled) {
                uVar3 = 0x3f5;
              }
              goto LAB_0016005d;
            }
          }
          if ((src.super_Operand_.field_0._any.signature & 0xf07) != 0x101 &&
              (src.super_Operand_.field_0._any.signature & 7) != 2) {
            return 4;
          }
          uVar3 = 0x18b;
          if (avxEnabled) {
            uVar3 = 0x3de;
          }
          uVar6 = 0x40000159;
          if (uVar10 < 0x21) {
            uVar6 = 0x20000151;
          }
          dst.super_Reg.super_Operand.super_Operand_.field_0._any.signature = 0x10000149;
          if (0x10 < uVar10) {
            dst.super_Reg.super_Operand.super_Operand_.field_0._any.signature = uVar6;
          }
          uVar7 = src.super_Operand_.field_0._any.signature & 3;
          goto LAB_0016014d;
        }
        uVar10 = (uint)bVar2;
        if (uVar11 * 2 < uVar7) {
          uVar10 = uVar11 * 2;
        }
        uVar9 = 0x83;
        if (avxEnabled) {
          uVar9 = 0x324;
        }
        uVar3 = 0x7d;
        if (avxEnabled) {
          uVar3 = 0x318;
        }
        if (uVar10 < 9) {
          uVar3 = uVar9;
        }
        if ((uVar10 & 0xfe) == 0x40) {
          dst.super_Reg.super_Operand.super_Operand_.field_0._any.signature = 0x20000151;
        }
        if ((src.super_Operand_.field_0._any.signature & 7) != 1) goto LAB_00160305;
        uVar6 = 0x40000159;
        if (uVar10 < 0x21) {
          uVar6 = 0x20000151;
        }
        uVar4 = 0x10000149;
        if (0x10 < uVar10) {
          uVar4 = uVar6;
        }
        goto LAB_00160156;
      }
      uVar10 = (uint)bVar2;
      if (uVar11 < uVar7) {
        uVar10 = (uint)bVar1;
      }
      if ((3 < srcTypeId - 0x2d && 9 < uVar3) &&
         ((src.super_Operand_.field_0._any.signature & 7) != 2)) {
        return 4;
      }
      if (uVar10 == 1) {
        uVar3 = 0x13f;
      }
      else if (uVar10 == 2) {
        uVar3 = 0x142;
      }
      else {
        uVar3 = uVar10 == 4 ^ 0x141;
      }
      if (((src.super_Operand_.field_0._any.signature & 0xf07) != 1) || (4 < uVar10))
      goto LAB_00160305;
    }
    src.super_Operand_.field_0._any.signature = 0x4000029;
  }
LAB_00160305:
  if ((src.super_Operand_.field_0._any.signature & 7) == 2) {
    src.super_Operand_.field_0._any.signature =
         uVar10 << 0x18 | src.super_Operand_.field_0._any.signature & 0xfffffa;
  }
  *(char **)(emitter + 0x48) = comment;
  EVar5 = CodeEmitter::emit((CodeEmitter *)emitter,uVar3,(Operand_ *)&dst,&src.super_Operand_);
  return EVar5;
}

Assistant:

ASMJIT_FAVOR_SIZE Error X86Internal::emitArgMove(X86Emitter* emitter,
  const X86Reg& dst_, uint32_t dstTypeId,
  const Operand_& src_, uint32_t srcTypeId, bool avxEnabled, const char* comment) {

  // Deduce optional `dstTypeId`, which may be `TypeId::kVoid` in some cases.
  if (!dstTypeId) dstTypeId = x86OpData.archRegs.regTypeToTypeId[dst_.getType()];

  // Invalid or abstract TypeIds are not allowed.
  ASMJIT_ASSERT(TypeId::isValid(dstTypeId) && !TypeId::isAbstract(dstTypeId));
  ASMJIT_ASSERT(TypeId::isValid(srcTypeId) && !TypeId::isAbstract(srcTypeId));

  X86Reg dst(dst_);
  Operand src(src_);

  uint32_t dstSize = TypeId::sizeOf(dstTypeId);
  uint32_t srcSize = TypeId::sizeOf(srcTypeId);

  int32_t instId = Inst::kIdNone;

  // Not a real loop, just 'break' is nicer than 'goto'.
  for (;;) {
    if (TypeId::isInt(dstTypeId)) {
      if (TypeId::isInt(srcTypeId)) {
        instId = X86Inst::kIdMovsx;
        uint32_t typeOp = (dstTypeId << 8) | srcTypeId;

        // Sign extend by using 'movsx'.
        if (typeOp == ((TypeId::kI16 << 8) | TypeId::kI8 ) ||
            typeOp == ((TypeId::kI32 << 8) | TypeId::kI8 ) ||
            typeOp == ((TypeId::kI32 << 8) | TypeId::kI16) ||
            typeOp == ((TypeId::kI64 << 8) | TypeId::kI8 ) ||
            typeOp == ((TypeId::kI64 << 8) | TypeId::kI16)) break;

        // Sign extend by using 'movsxd'.
        instId = X86Inst::kIdMovsxd;
        if (typeOp == ((TypeId::kI64 << 8) | TypeId::kI32)) break;
      }

      if (TypeId::isInt(srcTypeId) || src_.isMem()) {
        // Zero extend by using 'movzx' or 'mov'.
        if (dstSize <= 4 && srcSize < 4) {
          instId = X86Inst::kIdMovzx;
          dst.setSignature(X86Reg::signatureOfT<X86Reg::kRegGpd>());
        }
        else {
          // We should have caught all possibilities where `srcSize` is less
          // than 4, so we don't have to worry about 'movzx' anymore. Minimum
          // size is enough to determine if we want 32-bit or 64-bit move.
          instId = X86Inst::kIdMov;
          srcSize = std::min(srcSize, dstSize);

          dst.setSignature(srcSize == 4 ? X86Reg::signatureOfT<X86Reg::kRegGpd>()
                                        : X86Reg::signatureOfT<X86Reg::kRegGpq>());
          if (src.isReg()) src.setSignature(dst.getSignature());
        }
        break;
      }

      // NOTE: The previous branch caught all memory sources, from here it's
      // always register to register conversion, so catch the remaining cases.
      srcSize = std::min(srcSize, dstSize);

      if (TypeId::isMmx(srcTypeId)) {
        // 64-bit move.
        instId = X86Inst::kIdMovq;
        if (srcSize == 8) break;

        // 32-bit move.
        instId = X86Inst::kIdMovd;
        dst.setSignature(X86Reg::signatureOfT<X86Reg::kRegGpd>());
        break;
      }

      if (TypeId::isMask(srcTypeId)) {
        instId = X86Inst::kmovIdFromSize(srcSize);
        dst.setSignature(srcSize <= 4 ? X86Reg::signatureOfT<X86Reg::kRegGpd>()
                                      : X86Reg::signatureOfT<X86Reg::kRegGpq>());
        break;
      }

      if (TypeId::isVec(srcTypeId)) {
        // 64-bit move.
        instId = avxEnabled ? X86Inst::kIdVmovq : X86Inst::kIdMovq;
        if (srcSize == 8) break;

        // 32-bit move.
        instId = avxEnabled ? X86Inst::kIdVmovd : X86Inst::kIdMovd;
        dst.setSignature(X86Reg::signatureOfT<X86Reg::kRegGpd>());
        break;
      }
    }

    if (TypeId::isMmx(dstTypeId)) {
      instId = X86Inst::kIdMovq;
      srcSize = std::min(srcSize, dstSize);

      if (TypeId::isInt(srcTypeId) || src.isMem()) {
        // 64-bit move.
        if (srcSize == 8) break;

        // 32-bit move.
        instId = X86Inst::kIdMovd;
        if (src.isReg()) src.setSignature(X86Reg::signatureOfT<X86Reg::kRegGpd>());
        break;
      }

      if (TypeId::isMmx(srcTypeId)) break;

      // NOTE: This will hurt if `avxEnabled`.
      instId = X86Inst::kIdMovdq2q;
      if (TypeId::isVec(srcTypeId)) break;
    }

    if (TypeId::isMask(dstTypeId)) {
      srcSize = std::min(srcSize, dstSize);

      if (TypeId::isInt(srcTypeId) || TypeId::isMask(srcTypeId) || src.isMem()) {
        instId = X86Inst::kmovIdFromSize(srcSize);
        if (X86Reg::isGp(src) && srcSize <= 4) src.setSignature(X86Reg::signatureOfT<X86Reg::kRegGpd>());
        break;
      }
    }

    if (TypeId::isVec(dstTypeId)) {
      // By default set destination to XMM, will be set to YMM|ZMM if needed.
      dst.setSignature(X86Reg::signatureOfT<X86Reg::kRegXmm>());

      // NOTE: This will hurt if `avxEnabled`.
      if (X86Reg::isMm(src)) {
        // 64-bit move.
        instId = X86Inst::kIdMovq2dq;
        break;
      }

      // Argument conversion.
      uint32_t dstElement = TypeId::elementOf(dstTypeId);
      uint32_t srcElement = TypeId::elementOf(srcTypeId);

      if (dstElement == TypeId::kF32 && srcElement == TypeId::kF64) {
        srcSize = std::min(dstSize * 2, srcSize);
        dstSize = srcSize / 2;

        if (srcSize <= 8)
          instId = avxEnabled ? X86Inst::kIdVcvtss2sd : X86Inst::kIdCvtss2sd;
        else
          instId = avxEnabled ? X86Inst::kIdVcvtps2pd : X86Inst::kIdCvtps2pd;

        if (dstSize == 32)
          dst.setSignature(X86Reg::signatureOfT<X86Reg::kRegYmm>());
        if (src.isReg())
          src.setSignature(X86Reg::signatureOfVecBySize(srcSize));
        break;
      }

      if (dstElement == TypeId::kF64 && srcElement == TypeId::kF32) {
        srcSize = std::min(dstSize, srcSize * 2) / 2;
        dstSize = srcSize * 2;

        if (srcSize <= 4)
          instId = avxEnabled ? X86Inst::kIdVcvtsd2ss : X86Inst::kIdCvtsd2ss;
        else
          instId = avxEnabled ? X86Inst::kIdVcvtpd2ps : X86Inst::kIdCvtpd2ps;

        dst.setSignature(X86Reg::signatureOfVecBySize(dstSize));
        if (src.isReg() && srcSize >= 32)
          src.setSignature(X86Reg::signatureOfT<X86Reg::kRegYmm>());
        break;
      }

      srcSize = std::min(srcSize, dstSize);
      if (X86Reg::isGp(src) || src.isMem()) {
        // 32-bit move.
        if (srcSize <= 4) {
          instId = avxEnabled ? X86Inst::kIdVmovd : X86Inst::kIdMovd;
          if (src.isReg()) src.setSignature(X86Reg::signatureOfT<X86Reg::kRegGpd>());
          break;
        }

        // 64-bit move.
        if (srcSize == 8) {
          instId = avxEnabled ? X86Inst::kIdVmovq : X86Inst::kIdMovq;
          break;
        }
      }

      if (X86Reg::isVec(src) || src.isMem()) {
        instId = avxEnabled ? X86Inst::kIdVmovaps : X86Inst::kIdMovaps;
        uint32_t sign = X86Reg::signatureOfVecBySize(srcSize);

        dst.setSignature(sign);
        if (src.isReg()) src.setSignature(sign);
        break;
      }
    }

    return DebugUtils::errored(kErrorInvalidState);
  }

  if (src.isMem())
    src.as<X86Mem>().setSize(srcSize);

  emitter->setInlineComment(comment);
  return emitter->emit(instId, dst, src);
}